

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

char __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::GetCharacter(CordRepBtree *this,size_t offset)

{
  uint uVar1;
  ulong uVar2;
  CordRepBtree *pCVar3;
  ulong index;
  ulong uVar4;
  string_view sVar5;
  
  uVar2 = (this->super_CordRep).length;
  if (uVar2 <= offset) {
    __assert_fail("offset < length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3ea,"char absl::cord_internal::CordRepBtree::GetCharacter(size_t) const");
  }
  uVar1 = (uint)(this->super_CordRep).storage[0];
  while( true ) {
    if (uVar2 <= offset) {
      __assert_fail("offset < length",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x329,
                    "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOf(size_t) const"
                   );
    }
    uVar4 = (ulong)(this->super_CordRep).storage[1];
    pCVar3 = (CordRepBtree *)this->edges_[uVar4];
    uVar2 = (pCVar3->super_CordRep).length;
    index = uVar4;
    if (uVar2 <= offset) {
      do {
        offset = offset - uVar2;
        pCVar3 = (CordRepBtree *)this->edges_[index + 1];
        index = index + 1;
        uVar2 = (pCVar3->super_CordRep).length;
      } while (uVar2 <= offset);
    }
    if ((int)uVar1 < 1) {
      sVar5 = Data(this,index);
      return sVar5._M_str[offset];
    }
    if (index < uVar4) {
      __assert_fail("index >= begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
    }
    if ((this->super_CordRep).storage[2] <= index) break;
    uVar1 = uVar1 - 1;
    this = pCVar3;
    if ((pCVar3->super_CordRep).tag != '\x03') {
      __assert_fail("IsBtree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
    }
  }
  __assert_fail("index < end()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
}

Assistant:

char CordRepBtree::GetCharacter(size_t offset) const {
  assert(offset < length);
  const CordRepBtree* node = this;
  int height = node->height();
  for (;;) {
    Position front = node->IndexOf(offset);
    if (--height < 0) return node->Data(front.index)[front.n];
    offset = front.n;
    node = node->Edge(front.index)->btree();
  }
}